

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O0

void __thiscall ftxui::Border::Render(Border *this,Screen *screen)

{
  bool bVar1;
  __shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  Screen *screen_local;
  Border *this_local;
  
  this_00 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
            operator[](&(this->super_Node).children_,0);
  peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(this_00);
  (*peVar2->_vptr_Node[4])(peVar2,screen);
  if (((this->super_Node).box_.x_min < (this->super_Node).box_.x_max) &&
     ((this->super_Node).box_.y_min < (this->super_Node).box_.y_max)) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->charset);
    if (bVar1) {
      RenderChar(this,screen);
    }
    else {
      RenderPixel(this,screen);
    }
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    // Draw content.
    children_[0]->Render(screen);

    // Draw the border.
    if (box_.x_min >= box_.x_max || box_.y_min >= box_.y_max)
      return;

    if (!charset.empty())
      RenderPixel(screen);
    else
      RenderChar(screen);
  }